

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

CBlockIndex * ParseHashOrHeight(UniValue *param,ChainstateManager *chainman)

{
  pointer ppCVar1;
  int iVar2;
  uint uVar3;
  Chainstate *pCVar4;
  CBlockIndex *pCVar5;
  UniValue *pUVar6;
  int *in_R8;
  long in_FS_OFFSET;
  string_view name;
  int current_tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  int height;
  uint256 hash;
  int local_7c;
  unique_lock<std::recursive_mutex> local_78;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_device = &cs_main.super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  pCVar4 = ChainstateManager::ActiveChainstate(chainman);
  if (param->typ == VNUM) {
    uVar3 = UniValue::getInt<int>(param);
    local_68._M_dataplus._M_p._0_4_ = uVar3;
    if ((int)uVar3 < 0) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<int>(&local_48,"Target block height %d is negative",(int *)&local_68);
      JSONRPCError(pUVar6,-8,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_009dba34;
    }
    ppCVar1 = (pCVar4->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)(pCVar4->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3);
    local_7c = iVar2 + -1;
    if (iVar2 <= (int)uVar3) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<int,int>
                (&local_48,(tinyformat *)"Target block height %d after current tip %d",
                 (char *)&local_68,&local_7c,in_R8);
      JSONRPCError(pUVar6,-8,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_009dba34;
    }
    pCVar5 = ppCVar1[uVar3];
  }
  else {
    name._M_str = "hash_or_height";
    name._M_len = 0xe;
    ParseHashV((uint256 *)&local_48,param,name);
    pCVar5 = node::BlockManager::LookupBlockIndex(&chainman->m_blockman,(uint256 *)&local_48);
    if (pCVar5 == (CBlockIndex *)0x0) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Block not found","");
      JSONRPCError(pUVar6,-5,&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_009dba34;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar5;
  }
LAB_009dba34:
  __stack_chk_fail();
}

Assistant:

static const CBlockIndex* ParseHashOrHeight(const UniValue& param, ChainstateManager& chainman)
{
    LOCK(::cs_main);
    CChain& active_chain = chainman.ActiveChain();

    if (param.isNum()) {
        const int height{param.getInt<int>()};
        if (height < 0) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d is negative", height));
        }
        const int current_tip{active_chain.Height()};
        if (height > current_tip) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d after current tip %d", height, current_tip));
        }

        return active_chain[height];
    } else {
        const uint256 hash{ParseHashV(param, "hash_or_height")};
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);

        if (!pindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }

        return pindex;
    }
}